

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O1

void opengv::generateRandom2D3DCorrespondences
               (translation_t *position,rotation_t *rotation,translations_t *camOffsets,
               rotations_t *camRotations,size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *bearingVectors,points_t *points,
               vector<int,_std::allocator<int>_> *camCorrespondences,MatrixXd *gt)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  pointer pMVar6;
  pointer pMVar7;
  double *pdVar8;
  iterator iVar9;
  iterator __position;
  pointer piVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  MatrixXd *pMVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM5 [16];
  rotation_t camRotation_1;
  point_t p;
  rotation_t camRotation;
  undefined1 local_158 [16];
  variable_if_dynamic<long,__1> vStack_148;
  double dStack_140;
  MatrixXd *pMStack_138;
  variable_if_dynamic<long,__1> vStack_130;
  double dStack_128;
  double dStack_120;
  translation_t *local_118;
  undefined1 local_108 [24];
  double local_f0;
  undefined1 local_e8 [8];
  double *pdStack_e0;
  double local_d8;
  rotation_t *local_d0;
  double *local_c8;
  undefined8 local_c0;
  undefined1 *local_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  undefined1 *puStack_98;
  double *pdStack_90;
  double dStack_88;
  double dStack_80;
  double local_78;
  size_t local_68;
  double local_60;
  ulong local_58;
  double local_50;
  Vector3d local_48;
  
  local_f0 = noise;
  local_68 = numberPoints;
  local_60 = outlierFraction;
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    lVar23 = 0;
    uVar19 = 0;
    do {
      generateRandomPoint((Vector3d *)local_158,8.0,4.0);
      pdVar5 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar24 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      uVar20 = uVar24;
      if ((((ulong)(pdVar5 + uVar24 * uVar19) & 7) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)(pdVar5 + uVar24 * uVar19) >> 3) & 0x1fffffff) & 7),
         (long)uVar24 <= (long)uVar20)) {
        uVar20 = uVar24;
      }
      uVar21 = uVar24 - uVar20;
      uVar18 = uVar21 + 7;
      if (-1 < (long)uVar21) {
        uVar18 = uVar21;
      }
      if (0 < (long)uVar20) {
        uVar22 = 0;
        do {
          *(undefined8 *)((long)pdVar5 + uVar22 * 8 + uVar24 * lVar23) =
               *(undefined8 *)(local_158 + uVar22 * 8);
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
      uVar18 = (uVar18 & 0xfffffffffffffff8) + uVar20;
      if (7 < (long)uVar21) {
        do {
          uVar12 = *(undefined8 *)(local_158 + uVar20 * 8 + 8);
          lVar17 = (&vStack_148)[uVar20].m_value;
          dVar3 = (&dStack_140)[uVar20];
          pMVar13 = (&pMStack_138)[uVar20];
          lVar25 = (&vStack_130)[uVar20].m_value;
          lVar14 = (&vStack_130)[uVar20 + 1].m_value;
          dVar29 = (&dStack_120)[uVar20];
          puVar2 = (undefined8 *)((long)pdVar5 + uVar20 * 8 + uVar24 * lVar23);
          *puVar2 = *(undefined8 *)(local_158 + uVar20 * 8);
          puVar2[1] = uVar12;
          puVar2[2] = lVar17;
          puVar2[3] = dVar3;
          puVar2[4] = pMVar13;
          puVar2[5] = lVar25;
          puVar2[6] = lVar14;
          puVar2[7] = dVar29;
          uVar20 = uVar20 + 8;
        } while ((long)uVar20 < (long)uVar18);
      }
      if ((long)uVar18 < (long)uVar24) {
        do {
          *(undefined8 *)((long)pdVar5 + uVar18 * 8 + uVar24 * lVar23) =
               *(undefined8 *)(local_158 + uVar18 * 8);
          uVar18 = uVar18 + 1;
        } while (uVar24 != uVar18);
      }
      uVar19 = uVar19 + 1;
      lVar23 = lVar23 + 8;
    } while (uVar19 < (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols);
  }
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    local_58 = ((long)(camOffsets->
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(camOffsets->
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1;
    lVar23 = 0;
    uVar19 = 0;
    uVar24 = 0;
    do {
      pMVar6 = (camOffsets->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_108._0_16_ =
           *(undefined1 (*) [16])
            &pMVar6[uVar24].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data;
      dVar3 = *(double *)
               ((long)&pMVar6[uVar24].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data + 0x10);
      pMVar7 = (camRotations->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_78 = *(double *)
                  ((long)&pMVar7[uVar24].
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data + 0x40);
      pMVar7 = pMVar7 + uVar24;
      local_b8 = *(undefined1 **)
                  &(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data;
      dStack_b0 = *(double *)
                   ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + 8);
      dStack_a8 = *(double *)
                   ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + 0x10);
      dStack_a0 = *(double *)
                   ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + 0x18);
      puStack_98 = *(undefined1 **)
                    ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x20);
      pdStack_90 = *(double **)
                    ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x28);
      dStack_88 = *(double *)
                   ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + 0x30);
      dStack_80 = *(double *)
                   ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + 0x38);
      pdVar8 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      lVar17 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows * uVar19;
      pdVar5 = pdVar8 + lVar17;
      local_158._0_8_ = *pdVar5;
      local_158._8_8_ = pdVar5[1];
      vStack_148.m_value = (long)pdVar8[lVar17 + 2];
      iVar9._M_current =
           (points->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (points->
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)points,iVar9,(Matrix<double,_3,_1,_0,_3,_1> *)local_158);
      }
      else {
        ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[2] = (double)vStack_148.m_value;
        ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[0] = (double)local_158._0_8_;
        ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[1] = (double)local_158._8_8_;
        ppMVar1 = &(points->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      vStack_148.m_value =
           (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      local_158._8_8_ =
           (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
           vStack_148.m_value * uVar19;
      pMStack_138 = gt;
      vStack_130.m_value = 0;
      local_158._0_8_ = rotation;
      dStack_128 = (double)uVar19;
      dStack_120 = (double)vStack_148.m_value;
      local_118 = position;
      local_e8 = (undefined1  [8])rotation;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&pdStack_e0,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)(local_158 + 8));
      local_d0 = (rotation_t *)local_e8;
      local_c8 = pdStack_e0;
      local_c0 = 3;
      dVar26 = *pdStack_e0;
      dVar28 = pdStack_e0[1];
      dVar29 = pdStack_e0[2];
      auVar34._8_8_ = 0;
      auVar34._0_8_ =
           (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e8)->m_storage).m_data.
           array[2];
      auVar11 = vmovhpd_avx(auVar34,(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                     local_e8)->m_storage).m_data.array[5]);
      auVar30._0_8_ =
           dVar26 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e8)->m_storage
                    ).m_data.array[0] +
           dVar28 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e8)->m_storage
                    ).m_data.array[1] + dVar29 * auVar11._0_8_;
      auVar30._8_8_ =
           dVar26 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e8)->m_storage
                    ).m_data.array[3] +
           dVar28 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e8)->m_storage
                    ).m_data.array[4] + dVar29 * auVar11._8_8_;
      local_108._0_16_ = vsubpd_avx(auVar30,local_108._0_16_);
      local_50 = dVar29 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e8)->
                          m_storage).m_data.array[8] +
                 dVar26 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e8)->
                          m_storage).m_data.array[6] +
                 dVar28 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e8)->
                          m_storage).m_data.array[7];
      free((void *)pdStack_e0[-1]);
      dVar3 = local_50 - dVar3;
      auVar11._8_8_ = dStack_a0;
      auVar11._0_8_ = dStack_a8;
      auVar11 = vmovhpd_avx(auVar11,pdStack_90);
      local_e8 = (undefined1  [8])
                 (dVar3 * auVar11._0_8_ +
                 (double)local_108._0_8_ * (double)local_b8 + (double)local_108._8_8_ * dStack_b0);
      pdStack_e0 = (double *)
                   (dVar3 * auVar11._8_8_ +
                   (double)local_108._0_8_ * dStack_a0 +
                   (double)local_108._8_8_ * (double)puStack_98);
      local_d8 = dVar3 * local_78 +
                 (double)local_108._0_8_ * dStack_88 + (double)local_108._8_8_ * dStack_80;
      iVar9._M_current =
           (bearingVectors->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (bearingVectors->
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)bearingVectors,iVar9,(Matrix<double,_3,_1,_0,_3,_1> *)local_e8);
      }
      else {
        ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[2] = local_d8;
        ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[0] = (double)local_e8;
        ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[1] = (double)pdStack_e0;
        ppMVar1 = &(bearingVectors->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      pMVar6 = (bearingVectors->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar11 = *(undefined1 (*) [16])
                 ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar23);
      dVar3 = *(double *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar23 + 0x10);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar3 * dVar3 + auVar11._0_8_ * auVar11._0_8_ + auVar11._8_8_ * auVar11._8_8_;
      auVar30 = vsqrtpd_avx(auVar31);
      dVar29 = auVar30._0_8_;
      auVar35._8_8_ = dVar29;
      auVar35._0_8_ = dVar29;
      auVar11 = vdivpd_avx(auVar11,auVar35);
      *(undefined1 (*) [16])
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar23) = auVar11;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar23 + 0x10) = dVar3 / dVar29;
      if (0.0 < local_f0) {
        pMVar6 = (bearingVectors->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = *(double *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar23 + 0x10);
        pdVar5 = (double *)
                 ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar23);
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = *pdVar5;
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = pdVar5[1];
        addNoise((Vector3d *)local_158,local_f0,&local_48);
        pMVar6 = (bearingVectors->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar23 + 0x10) = vStack_148.m_value;
        puVar2 = (undefined8 *)
                 ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar23);
        *puVar2 = local_158._0_8_;
        puVar2[1] = local_158._8_8_;
      }
      local_158._0_4_ = (int)uVar24;
      __position._M_current =
           (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (camCorrespondences,__position,(int *)local_158);
      }
      else {
        *__position._M_current = (int)uVar24;
        (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar24 = uVar24 + 1;
      if (local_58 < uVar24) {
        uVar24 = 0;
      }
      uVar19 = uVar19 + 1;
      lVar23 = lVar23 + 0x18;
    } while (uVar19 < (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols);
  }
  auVar11 = vcvtusi2sd_avx512f(in_XMM5,local_68);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar11._0_8_ * local_60;
  auVar11 = vroundsd_avx(auVar27,auVar27,9);
  lVar23 = vcvttsd2usi_avx512f(auVar11);
  if (lVar23 != 0) {
    lVar17 = 4;
    lVar25 = 0;
    do {
      piVar10 = (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar4 = piVar10[lVar25];
      pMVar6 = (camOffsets->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_108._0_16_ =
           *(undefined1 (*) [16])
            &pMVar6[iVar4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data;
      dVar3 = *(double *)
               ((long)&pMVar6[iVar4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data + 0x10);
      iVar4 = piVar10[lVar25];
      pMVar7 = (camRotations->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_118 = *(translation_t **)
                   ((long)&pMVar7[iVar4].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data + 0x40);
      pMVar7 = pMVar7 + iVar4;
      local_158._0_8_ =
           (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
      local_158._8_8_ =
           *(double *)
            ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                    .m_data + 8);
      vStack_148.m_value =
           *(long *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x10);
      dStack_140 = *(double *)
                    ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x18);
      pMStack_138 = *(MatrixXd **)
                     ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data + 0x20);
      vStack_130.m_value =
           *(long *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x28);
      dStack_128 = *(double *)
                    ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x30);
      dStack_120 = *(double *)
                    ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x38);
      generateRandomPoint((Vector3d *)local_e8,8.0,4.0);
      auVar16._8_8_ = pdStack_e0;
      auVar16._0_8_ = local_e8;
      auVar11 = vsubpd_avx(auVar16,*(undefined1 (*) [16])
                                    (position->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                    m_storage.m_data.array);
      dVar29 = local_d8 -
               (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
      pdStack_90 = &dStack_b0;
      dVar26 = auVar11._0_8_;
      dVar28 = auVar11._8_8_;
      auVar37._8_8_ = 0;
      auVar37._0_8_ =
           (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
           .array[2];
      auVar11 = vmovhpd_avx(auVar37,(rotation->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                    m_storage.m_data.array[5]);
      auVar33._0_8_ =
           dVar29 * auVar11._0_8_ +
           dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[0] +
           dVar28 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[1];
      auVar33._8_8_ =
           dVar29 * auVar11._8_8_ +
           dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[3] +
           dVar28 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[4];
      auVar11 = vsubpd_avx(auVar33,local_108._0_16_);
      pMVar6 = (bearingVectors->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b8 = local_158;
      dStack_b0 = auVar11._0_8_;
      dStack_a8 = auVar11._8_8_;
      dStack_a0 = (dVar29 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                            .m_storage.m_data.array[8] +
                  dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[6] +
                  dVar28 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[7]) - dVar3;
      dStack_88 = 1.48219693752374e-323;
      auVar15._8_8_ = dStack_140;
      auVar15._0_8_ = vStack_148.m_value;
      auVar11 = vmovhpd_avx(auVar15,vStack_130.m_value);
      pdVar5 = (double *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar17 * 4 + -0x10);
      *pdVar5 = dStack_a0 * auVar11._0_8_ +
                dStack_b0 * (double)local_158._0_8_ + dStack_a8 * (double)local_158._8_8_;
      pdVar5[1] = dStack_a0 * auVar11._8_8_ +
                  dStack_b0 * dStack_140 + dStack_a8 * (double)pMStack_138;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar17 * 4) =
           dStack_a0 * (double)local_118 + dStack_b0 * dStack_128 + dStack_a8 * dStack_120;
      pMVar6 = (bearingVectors->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar11 = *(undefined1 (*) [16])
                 ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar17 * 4 + -0x10);
      dVar3 = *(double *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar17 * 4);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar3 * dVar3 + auVar11._0_8_ * auVar11._0_8_ + auVar11._8_8_ * auVar11._8_8_;
      auVar30 = vsqrtpd_avx(auVar32);
      dVar29 = auVar30._0_8_;
      auVar36._8_8_ = dVar29;
      auVar36._0_8_ = dVar29;
      auVar11 = vdivpd_avx(auVar11,auVar36);
      *(undefined1 (*) [16])
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar17 * 4 + -0x10) = auVar11;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar17 * 4) = dVar3 / dVar29;
      lVar25 = lVar25 + 1;
      lVar17 = lVar17 + 6;
      puStack_98 = local_b8;
    } while (lVar23 != lVar25);
  }
  return;
}

Assistant:

void
opengv::generateRandom2D3DCorrespondences(
    const translation_t & position,
    const rotation_t & rotation,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & bearingVectors,
    points_t & points,
    std::vector<int> & camCorrespondences,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 2D3D-correspondences by looping through the cameras
  size_t numberCams = camOffsets.size();
  size_t camCorrespondence = 0;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //get the camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //store the point
    points.push_back(gt.col(i));

    //project the point into the viewpoint frame
    point_t bodyPoint = rotation.transpose()*(gt.col(i) - position);

    //project the point into the camera frame
    bearingVectors.push_back(camRotation.transpose()*(bodyPoint - camOffset));

    //normalize the bearing-vector to 1
    bearingVectors[i] = bearingVectors[i] / bearingVectors[i].norm();

    //add noise
    if( noise > 0.0 )
      bearingVectors[i] = addNoise(noise,bearingVectors[i]);

    //push back the camera correspondence
    camCorrespondences.push_back(camCorrespondence++);
    if(camCorrespondence > (numberCams-1) )
      camCorrespondence = 0;
  }

  //add outliers
  //compute the number of outliers based on fraction
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  //make the first numberOutliers points be outliers
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //extract the camera transformation
    translation_t camOffset = camOffsets[camCorrespondences[i]];
    rotation_t camRotation = camRotations[camCorrespondences[i]];

    //create random point
    point_t p = generateRandomPoint(8,4);

    //project into viewpoint frame
    point_t bodyPoint = rotation.transpose()*(p - position);

    //project into camera-frame and use as outlier measurement
    bearingVectors[i] = camRotation.transpose()*(bodyPoint - camOffset);

    //normalize the bearing vector
    bearingVectors[i] = bearingVectors[i] / bearingVectors[i].norm();
  }
}